

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O2

int db_debug(lua_State *L)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  size_t size;
  char buffer [250];
  
  while( true ) {
    fputs("lua_debug> ",_stderr);
    fflush(_stderr);
    pcVar2 = fgets(buffer,0xfa,_stdin);
    if (pcVar2 == (char *)0x0) {
      return 0;
    }
    iVar1 = bcmp(buffer,"cont\n",6);
    if (iVar1 == 0) break;
    size = strlen(buffer);
    iVar1 = luaL_loadbufferx(L,buffer,size,"=(debug command)",(char *)0x0);
    if ((iVar1 != 0) || (iVar1 = lua_pcallk(L,0,0,0,0,(lua_CFunction)0x0), iVar1 != 0)) {
      __stream = _stderr;
      pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
      fprintf(__stream,"%s\n",pcVar2);
      fflush(_stderr);
    }
    lua_settop(L,0);
  }
  return 0;
}

Assistant:

static int db_debug (lua_State *L) {
  for (;;) {
    char buffer[250];
    luai_writestringerror("%s", "lua_debug> ");
    if (fgets(buffer, sizeof(buffer), stdin) == 0 ||
        strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
        lua_pcall(L, 0, 0, 0))
      luai_writestringerror("%s\n", lua_tostring(L, -1));
    lua_settop(L, 0);  /* remove eventual returns */
  }
}